

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapistd.c
# Opt level: O3

JDIMENSION jpeg_write_raw_data(j_compress_ptr cinfo,JSAMPIMAGE data,JDIMENSION num_lines)

{
  int iVar1;
  jpeg_error_mgr *pjVar2;
  jpeg_progress_mgr *pjVar3;
  boolean bVar4;
  uint uVar5;
  
  iVar1 = cinfo->global_state;
  if (iVar1 != 0x66) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x15;
    (pjVar2->msg_parm).i[0] = iVar1;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  uVar5 = cinfo->image_height;
  if (cinfo->next_scanline < uVar5) {
    pjVar3 = cinfo->progress;
    if (pjVar3 != (jpeg_progress_mgr *)0x0) {
      pjVar3->pass_counter = (ulong)cinfo->next_scanline;
      pjVar3->pass_limit = (ulong)uVar5;
      (*pjVar3->progress_monitor)((j_common_ptr)cinfo);
    }
    if (cinfo->master->call_pass_startup != 0) {
      (*cinfo->master->pass_startup)(cinfo);
    }
    uVar5 = cinfo->max_v_samp_factor * 8;
    if (num_lines < uVar5) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x18;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    bVar4 = (*cinfo->coef->compress_data)(cinfo,data);
    if (bVar4 != 0) {
      cinfo->next_scanline = cinfo->next_scanline + uVar5;
      return uVar5;
    }
  }
  else {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x7e;
    (*pjVar2->emit_message)((j_common_ptr)cinfo,-1);
  }
  return 0;
}

Assistant:

GLOBAL(JDIMENSION)
jpeg_write_raw_data (j_compress_ptr cinfo, JSAMPIMAGE data,
		     JDIMENSION num_lines)
{
  JDIMENSION lines_per_iMCU_row;

  if (cinfo->global_state != CSTATE_RAW_OK)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  if (cinfo->next_scanline >= cinfo->image_height) {
    WARNMS(cinfo, JWRN_TOO_MUCH_DATA);
    return 0;
  }

  /* Call progress monitor hook if present */
  if (cinfo->progress != NULL) {
    cinfo->progress->pass_counter = (long) cinfo->next_scanline;
    cinfo->progress->pass_limit = (long) cinfo->image_height;
    (*cinfo->progress->progress_monitor) ((j_common_ptr) cinfo);
  }

  /* Give master control module another chance if this is first call to
   * jpeg_write_raw_data.  This lets output of the frame/scan headers be
   * delayed so that application can write COM, etc, markers between
   * jpeg_start_compress and jpeg_write_raw_data.
   */
  if (cinfo->master->call_pass_startup)
    (*cinfo->master->pass_startup) (cinfo);

  /* Verify that at least one iMCU row has been passed. */
  lines_per_iMCU_row = cinfo->max_v_samp_factor * DCTSIZE;
  if (num_lines < lines_per_iMCU_row)
    ERREXIT(cinfo, JERR_BUFFER_SIZE);

  /* Directly compress the row. */
  if (! (*cinfo->coef->compress_data) (cinfo, data)) {
    /* If compressor did not consume the whole row, suspend processing. */
    return 0;
  }

  /* OK, we processed one iMCU row. */
  cinfo->next_scanline += lines_per_iMCU_row;
  return lines_per_iMCU_row;
}